

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O1

void EdgeDetectionHelper::find
               (EdgeDetectionBase<double> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  uint uVar1;
  undefined1 auVar2 [16];
  uchar *__n;
  uint uVar3;
  ulong uVar4;
  EVP_PKEY_CTX *pEVar5;
  uint uVar6;
  uchar *sig;
  uint *puVar7;
  ulong uVar8;
  uchar *tbs;
  undefined4 in_register_0000008c;
  size_t tbslen;
  EVP_PKEY_CTX *pEVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  vector<double,_std::allocator<double>_> edgePositive;
  vector<double,_std::allocator<double>_> edgeNegative;
  vector<int,_std::allocator<int>_> secondDerivative;
  vector<int,_std::allocator<int>_> firstDerivative;
  vector<int,_std::allocator<int>_> data;
  vector<double,_std::allocator<double>_> local_c8;
  double local_b0;
  uchar *local_a8;
  EdgeDetectionBase<double> *local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  auVar12 = in_ZMM1._0_16_;
  auVar11 = in_ZMM0._0_16_;
  tbslen = CONCAT44(in_register_0000008c,height);
  __n = (uchar *)(ulong)height;
  uVar10 = (ulong)width;
  pEVar9 = (EVP_PKEY_CTX *)(ulong)x;
  local_a0 = edgeDetection;
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar4 = uVar10;
  pEVar5 = pEVar9;
  tbs = __n;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  EdgeParameter::verify(edgeParameter,pEVar5,sig,uVar4,tbs,tbslen);
  if (edgeParameter->direction < TOP_TO_BOTTOM) {
    height = width;
  }
  if (3 < height) {
    local_80 = &local_a0->negativeEdgePoint;
    uVar1 = image->_rowSize;
    local_a8 = __n;
    if (edgeParameter->direction < TOP_TO_BOTTOM) {
      std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar10,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,uVar10,(value_type_conflict3 *)&local_78,(allocator_type *)&local_c8);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,uVar10,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_98);
      uVar3 = (int)local_a8 + 1;
      local_a8 = (uchar *)(ulong)uVar3;
      if (uVar3 != edgeParameter->groupFactor) {
        auVar11 = vcvtusi2sd_avx512f(auVar11,(x - 1) + width);
        local_b0 = auVar11._0_8_;
        pEVar9 = pEVar9 + (long)(image->_data + uVar1 * y);
        auVar11 = vcvtusi2sd_avx512f(auVar12,x);
        uVar3 = 0;
        do {
          if (width != 0) {
            uVar4 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar4] = (uint)(byte)pEVar9[uVar4];
              uVar4 = uVar4 + 1;
            } while (uVar10 != uVar4);
          }
          if (1 < edgeParameter->groupFactor) {
            uVar4 = 1;
            uVar6 = uVar1;
            do {
              if (width != 0) {
                uVar8 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8] =
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8] + (uint)(byte)pEVar9[uVar8 + uVar6];
                  uVar8 = uVar8 + 1;
                } while (uVar10 != uVar8);
              }
              uVar4 = uVar4 + 1;
              uVar6 = uVar6 + uVar1;
            } while (uVar4 < edgeParameter->groupFactor);
          }
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8edeb::findEdgePoints<double>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == LEFT_TO_RIGHT);
          if (edgeParameter->direction == LEFT_TO_RIGHT) {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,y + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveXEdge<double>
                        (&local_c8,&local_a0->positiveEdgePoint,auVar11._0_8_,
                         (double)(auVar2._0_4_ * 0.5 + auVar12._0_4_));
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,y + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeXEdge<double>
                        (&local_98,local_80,local_b0,(double)(auVar2._0_4_ * 0.5 + auVar12._0_4_));
            }
          }
          else {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,y + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeXEdge<double>
                        (&local_98,&local_a0->positiveEdgePoint,local_b0,
                         (double)(auVar2._0_4_ * 0.5 + auVar12._0_4_));
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,y + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveXEdge<double>
                        (&local_c8,local_80,auVar11._0_8_,
                         (double)(auVar2._0_4_ * 0.5 + auVar12._0_4_));
            }
          }
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar3 = uVar3 + edgeParameter->skipFactor;
          pEVar9 = pEVar9 + edgeParameter->skipFactor * uVar1;
        } while (uVar3 < (int)local_a8 - edgeParameter->groupFactor);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,(size_type)__n,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,(size_type)__n,(value_type_conflict3 *)&local_78,
                 (allocator_type *)&local_c8);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(size_type)__n,(value_type_conflict3 *)&local_c8,
                 (allocator_type *)&local_98);
      if (width + 1 != edgeParameter->groupFactor) {
        pEVar9 = pEVar9 + (long)(image->_data + uVar1 * y);
        auVar11 = vcvtusi2sd_avx512f(auVar11,(y - 1) + (int)local_a8);
        local_b0 = auVar11._0_8_;
        uVar10 = (ulong)(uVar1 * (int)local_a8);
        auVar11 = vcvtusi2sd_avx512f(auVar12,y);
        uVar3 = 0;
        do {
          if (uVar10 != 0) {
            uVar4 = 0;
            puVar7 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
            do {
              *puVar7 = (uint)(byte)pEVar9[uVar4];
              puVar7 = puVar7 + 1;
              uVar4 = uVar4 + uVar1;
            } while (uVar10 != uVar4);
          }
          if (1 < edgeParameter->groupFactor) {
            uVar4 = 1;
            pEVar5 = pEVar9;
            do {
              pEVar5 = pEVar5 + 1;
              if (uVar10 != 0) {
                uVar8 = 0;
                puVar7 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                do {
                  *puVar7 = *puVar7 + (uint)(byte)pEVar5[uVar8];
                  puVar7 = puVar7 + 1;
                  uVar8 = uVar8 + uVar1;
                } while (uVar10 != uVar8);
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 < edgeParameter->groupFactor);
          }
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8edeb::findEdgePoints<double>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == TOP_TO_BOTTOM);
          if (edgeParameter->direction == TOP_TO_BOTTOM) {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,x + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveYEdge<double>
                        (&local_c8,&local_a0->positiveEdgePoint,
                         (double)(auVar2._0_4_ * 0.5 + auVar12._0_4_),auVar11._0_8_);
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,x + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeYEdge<double>
                        (&local_98,local_80,(double)(auVar2._0_4_ * 0.5 + auVar12._0_4_),local_b0);
            }
          }
          else {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,x + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeYEdge<double>
                        (&local_98,&local_a0->positiveEdgePoint,
                         (double)(auVar2._0_4_ * 0.5 + auVar12._0_4_),local_b0);
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar12 = vcvtusi2ss_avx512f(in_XMM2,x + uVar3);
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveYEdge<double>
                        (&local_c8,local_80,(double)(auVar2._0_4_ * 0.5 + auVar12._0_4_),
                         auVar11._0_8_);
            }
          }
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar3 = uVar3 + edgeParameter->skipFactor;
          pEVar9 = pEVar9 + edgeParameter->skipFactor;
        } while (uVar3 < (width + 1) - edgeParameter->groupFactor);
      }
    }
    if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<double> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}